

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hudmessages.cpp
# Opt level: O3

void __thiscall
DHUDMessageTypeOnFadeOut::DoDraw
          (DHUDMessageTypeOnFadeOut *this,int linenum,int x,int y,bool clean,int hudheight)

{
  EColorRange normalcolor;
  int iVar1;
  FFont *font;
  char *string;
  DFrameBuffer *this_00;
  int iVar2;
  int iVar3;
  int iVar4;
  
  if ((this->super_DHUDMessageFadeOut).super_DHUDMessage.State != 3) {
    DHUDMessageFadeOut::DoDraw(&this->super_DHUDMessageFadeOut,linenum,x,y,clean,hudheight);
    return;
  }
  if (this->CurrLine <= linenum) {
    if (this->CurrLine == linenum) {
      if (hudheight == 0) {
        iVar2 = active_con_scaletext();
        this_00 = screen;
        font = (this->super_DHUDMessageFadeOut).super_DHUDMessage.Font;
        string = (this->super_DHUDMessageFadeOut).super_DHUDMessage.Lines[linenum].Text.Chars;
        normalcolor = (this->super_DHUDMessageFadeOut).super_DHUDMessage.TextColor;
        if (iVar2 < 2) {
          DCanvas::DrawText((DCanvas *)screen,font,normalcolor,x,y,string,0x40001393,
                            (this->super_DHUDMessageFadeOut).super_DHUDMessage.Alpha,(ulong)clean,
                            0x400013b7,(ulong)(uint)this->LineVisible,0x4000138c,0x400013a9,
                            (ulong)(this->super_DHUDMessageFadeOut).super_DHUDMessage.Style.AsDWORD,
                            0);
        }
        else {
          iVar2 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
          iVar3 = active_con_scaletext();
          iVar1 = (screen->super_DSimpleCanvas).super_DCanvas.Height;
          iVar4 = active_con_scaletext();
          DCanvas::DrawText((DCanvas *)this_00,font,normalcolor,x,y,string,0x40001399,
                            (this->super_DHUDMessageFadeOut).super_DHUDMessage.Alpha,
                            (long)iVar2 / (long)iVar3 & 0xffffffff,0x4000139a,
                            (long)iVar1 / (long)iVar4 & 0xffffffff,0x400013a8,1,0x400013b7,
                            (ulong)(uint)this->LineVisible,0x4000138c,0x400013a9,
                            (ulong)(this->super_DHUDMessageFadeOut).super_DHUDMessage.Style.AsDWORD,
                            0);
        }
      }
      else {
        DCanvas::DrawText((DCanvas *)screen,(this->super_DHUDMessageFadeOut).super_DHUDMessage.Font,
                          (this->super_DHUDMessageFadeOut).super_DHUDMessage.TextColor,x,y,
                          (this->super_DHUDMessageFadeOut).super_DHUDMessage.Lines[linenum].Text.
                          Chars,0x40001399,(this->super_DHUDMessageFadeOut).super_DHUDMessage.Alpha,
                          (ulong)(uint)(this->super_DHUDMessageFadeOut).super_DHUDMessage.HUDWidth,
                          0x4000139a,(ulong)(uint)hudheight,0x400013a3,
                          (ulong)(uint)(this->super_DHUDMessageFadeOut).super_DHUDMessage.ClipLeft,
                          0x400013a4,
                          (ulong)(uint)(this->super_DHUDMessageFadeOut).super_DHUDMessage.ClipRight,
                          0x400013a1,
                          (ulong)(uint)(this->super_DHUDMessageFadeOut).super_DHUDMessage.ClipTop,
                          0x400013a2,
                          (ulong)(uint)(this->super_DHUDMessageFadeOut).super_DHUDMessage.ClipBot,
                          0x4000138c,0x400013b7,(ulong)(uint)this->LineVisible,0x400013a9,
                          (ulong)(this->super_DHUDMessageFadeOut).super_DHUDMessage.Style.AsDWORD,0)
        ;
      }
    }
    return;
  }
  DHUDMessage::DoDraw((DHUDMessage *)this,linenum,x,y,clean,hudheight);
  return;
}

Assistant:

void DHUDMessageTypeOnFadeOut::DoDraw (int linenum, int x, int y, bool clean, int hudheight)
{
	if (State == 3)
	{
		if (linenum < CurrLine)
		{
			DHUDMessage::DoDraw (linenum, x, y, clean, hudheight);
		}
		else if (linenum == CurrLine)
		{
			if (hudheight == 0)
			{
				if (active_con_scaletext() <= 1)
				{
					screen->DrawText (Font, TextColor, x, y, Lines[linenum].Text,
						DTA_CleanNoMove, clean,
						DTA_TextLen, LineVisible,
						DTA_AlphaF, Alpha,
						DTA_RenderStyle, Style,
						TAG_DONE);
				}
				else
				{
					screen->DrawText (Font, TextColor, x, y, Lines[linenum].Text,
						DTA_VirtualWidth, SCREENWIDTH / active_con_scaletext(),
						DTA_VirtualHeight, SCREENHEIGHT / active_con_scaletext(),
						DTA_KeepRatio, true,
						DTA_TextLen, LineVisible,
						DTA_AlphaF, Alpha,
						DTA_RenderStyle, Style,
						TAG_DONE);
				}
			}
			else
			{
				screen->DrawText (Font, TextColor, x, y, Lines[linenum].Text,
					DTA_VirtualWidth, HUDWidth,
					DTA_VirtualHeight, hudheight,
					DTA_ClipLeft, ClipLeft,
					DTA_ClipRight, ClipRight,
					DTA_ClipTop, ClipTop,
					DTA_ClipBottom, ClipBot,
					DTA_AlphaF, Alpha,
					DTA_TextLen, LineVisible,
					DTA_RenderStyle, Style,
					TAG_DONE);
			}
		}
	}
	else
	{
		DHUDMessageFadeOut::DoDraw (linenum, x, y, clean, hudheight);
	}
}